

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discoverer.c
# Opt level: O2

CgreenVector * discover_tests_in(char *filename,_Bool verbose)

{
  int iVar1;
  FILE *pFVar2;
  CgreenVector *pCVar3;
  size_t sVar4;
  char *pcVar5;
  TestItem *pTVar6;
  undefined8 uStack_810;
  char acStack_808 [1008];
  char nm_command [1000];
  
  uStack_810 = 0x1034fe;
  pFVar2 = open_file(filename,"r");
  if (pFVar2 == (FILE *)0x0) {
    pCVar3 = (CgreenVector *)0x0;
  }
  else {
    uStack_810 = 0x10350f;
    close_file(pFVar2);
    pCVar3 = (CgreenVector *)0x0;
    uStack_810 = 0x10353d;
    __sprintf_chk(nm_command,1,1000,"%s \'%s\' 2>&1","/usr/bin/nm",filename);
    uStack_810 = 0x10354c;
    pFVar2 = open_process(nm_command,"r");
    if (pFVar2 != (FILE *)0x0) {
      uStack_810 = 0x103564;
      pCVar3 = (CgreenVector *)create_cgreen_vector(destroy_test_item);
      uStack_810 = 0x10357a;
      iVar1 = read_line(pFVar2,acStack_808,999);
      while (-1 < iVar1) {
        uStack_810 = 0x103591;
        sVar4 = strlen(acStack_808);
        if (acStack_808[sVar4 - 1] != '\n') {
          uStack_810 = 0x1035b0;
          panic("tools/discoverer.c",0x2b,"Too long line in nm output");
        }
        uStack_810 = 0x1035b8;
        pcVar5 = cgreen_spec_start_of(acStack_808);
        if (pcVar5 != (char *)0x0) {
          uStack_810 = 0x1035c8;
          pcVar5 = strstr(acStack_808," D ");
          if (pcVar5 != (char *)0x0) {
            uStack_810 = 0x1035d5;
            sVar4 = strlen(acStack_808);
            if (acStack_808[sVar4 - 1] == '\n') {
              acStack_808[sVar4 - 1] = '\0';
            }
            uStack_810 = 0x1035e9;
            pcVar5 = cgreen_spec_start_of(acStack_808);
            uStack_810 = 0x1035f1;
            pTVar6 = create_test_item_from(pcVar5);
            if (verbose) {
              uStack_810 = 0x103615;
              __printf_chk(1,"Discovered %s:%s (%s)\n",pTVar6->context_name,pTVar6->test_name,
                           pTVar6->specification_name);
            }
            uStack_810 = 0x103620;
            cgreen_vector_add(pCVar3,pTVar6);
          }
        }
        uStack_810 = 0x103630;
        iVar1 = read_line(pFVar2,acStack_808,999);
      }
      uStack_810 = 0x10363d;
      close_process(pFVar2);
    }
  }
  return pCVar3;
}

Assistant:

CgreenVector *discover_tests_in(const char *filename, bool verbose) {
    FILE *library = open_file(filename, "r");
    if (library == NULL)
        return NULL;
    close_file(library);

    char nm_command[1000];
    sprintf(nm_command, "%s '%s' 2>&1", NM_EXECUTABLE, filename);
    FILE *nm_output_pipe = open_process(nm_command, "r");
    if (nm_output_pipe == NULL)
        return NULL;

    CgreenVector *tests = create_cgreen_vector((GenericDestructor)&destroy_test_item);
    add_all_tests_from(nm_output_pipe, tests, verbose);
    close_process(nm_output_pipe);

    return tests;
}